

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_decimal.hpp
# Opt level: O2

uint duckdb::TryCastDecimalCInternal<unsigned_int>(duckdb_result *source,idx_t col,idx_t row)

{
  bool bVar1;
  uint uVar2;
  undefined8 in_RAX;
  uint result_value;
  uint local_4;
  
  local_4 = (uint)((ulong)in_RAX >> 0x20);
  bVar1 = CastDecimalCInternal<unsigned_int>(source,&local_4,col,row);
  uVar2 = 0;
  if (bVar1) {
    uVar2 = local_4;
  }
  return uVar2;
}

Assistant:

RESULT_TYPE TryCastDecimalCInternal(duckdb_result *source, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!CastDecimalCInternal<RESULT_TYPE>(source, result_value, col, row)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}